

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  undefined8 uVar1;
  bool bVar2;
  log_val_type lVar3;
  type tVar4;
  srv_role sVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  element_type *peVar10;
  element_type *peVar11;
  undefined4 extraout_var;
  element_type *peVar12;
  size_type sVar13;
  element_type *this_00;
  snapshot *psVar14;
  socklen_t *psVar15;
  socklen_t *__addr_len;
  undefined8 *puVar16;
  undefined4 extraout_var_00;
  element_type *peVar17;
  element_type *peVar18;
  buffer *pbVar19;
  size_t sVar20;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  sockaddr *__addr;
  sockaddr *__addr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar22;
  ptr<buffer> done_ctx_1;
  ptr<buffer> done_ctx;
  ptr<snapshot_sync_req> sync_req;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  snapshot_sync_req *in_stack_00000240;
  raft_server *in_stack_00000248;
  ptr<resp_msg> *resp;
  memory_order __b;
  ptr<buffer> *in_stack_fffffffffffffd78;
  resp_msg *in_stack_fffffffffffffd80;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  buffer *in_stack_fffffffffffffd98;
  buffer *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  byte b;
  buffer *in_stack_fffffffffffffdb0;
  raft_server *in_stack_fffffffffffffe10;
  raft_server *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffec8;
  string local_f8 [48];
  string local_c8 [32];
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_a8;
  undefined4 local_9c;
  string local_98 [32];
  undefined8 local_78;
  int32 local_70;
  undefined4 local_6c;
  ulong local_68;
  byte local_5d;
  string local_50 [32];
  req_msg *local_30;
  undefined8 local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  b = (byte)((ulong)in_stack_fffffffffffffda8 >> 0x38);
  local_30 = in_RDX;
  uVar8 = msg_base::get_term(&in_RDX->super_msg_base);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22165b);
  uVar9 = srv_state::get_term((srv_state *)0x221663);
  if ((uVar8 == uVar9) &&
     (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd88), !bVar2)
     ) {
    sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x2216a7);
    if (sVar5 == candidate) {
      become_follower(in_stack_fffffffffffffe10);
    }
    else {
      sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x2216d2);
      if (sVar5 == leader) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar2) {
          peVar12 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x22170c);
          iVar7 = (*peVar12->_vptr_logger[7])();
          if (1 < iVar7) {
            peVar12 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x221732);
            uVar6 = msg_base::get_src(&local_30->super_msg_base);
            msg_if_given_abi_cxx11_
                      ((char *)local_50,
                       "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                       ,(ulong)uVar6);
            (*peVar12->_vptr_logger[8])
                      (peVar12,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0xfb,local_50);
            std::__cxx11::string::~string(local_50);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2217e4);
        peVar10 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2217ec);
        (*peVar10->_vptr_state_mgr[8])(peVar10,0xfffffff6);
        exit(-1);
      }
      restart_election_timer(in_stack_fffffffffffffe40);
    }
  }
  local_5d = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x221831);
  local_68 = srv_state::get_term((srv_state *)0x221839);
  local_6c = 0x11;
  local_70 = msg_base::get_src(&local_30->super_msg_base);
  peVar11 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x22188b);
  iVar7 = (*peVar11->_vptr_log_store[2])();
  local_78 = CONCAT44(extraout_var,iVar7);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffffd98,
             (msg_type *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (int *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80,
             (unsigned_long *)in_stack_fffffffffffffd78);
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd88);
  if (!bVar2) {
    uVar8 = msg_base::get_term(&local_30->super_msg_base);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x221918);
    uVar9 = srv_state::get_term((srv_state *)0x221920);
    if (uVar8 < uVar9) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      _Var21._M_pi = extraout_RDX;
      if (bVar2) {
        peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x221974);
        iVar7 = (*peVar12->_vptr_logger[7])();
        _Var21._M_pi = extraout_RDX_00;
        if (2 < iVar7) {
          peVar12 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2219ad);
          uVar8 = msg_base::get_term(&local_30->super_msg_base);
          std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2219e0);
          uVar9 = srv_state::get_term((srv_state *)0x2219e8);
          msg_if_given_abi_cxx11_
                    ((char *)local_98,
                     "received an install snapshot request (%lu) which has lower term than this server (%lu), decline the request"
                     ,uVar8,uVar9);
          (*peVar12->_vptr_logger[8])
                    (peVar12,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_req",0x111,local_98);
          std::__cxx11::string::~string(local_98);
          _Var21._M_pi = extraout_RDX_01;
        }
      }
      local_5d = 1;
      local_9c = 1;
      goto LAB_002222ac;
    }
  }
  local_a8 = req_msg::log_entries(local_30);
  sVar13 = std::
           vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ::size(local_a8);
  if (sVar13 == 1) {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_a8,0);
    this_00 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x221b07);
    lVar3 = log_entry::get_val_type(this_00);
    if (lVar3 == snp_sync_req) {
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::operator[](local_a8,0);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x221c4f);
      log_entry::get_buf((log_entry *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90))
      ;
      snapshot_sync_req::deserialize(in_stack_fffffffffffffd98);
      std::__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x221c85);
      psVar14 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x221c8d);
      psVar15 = (socklen_t *)snapshot::get_last_log_idx(psVar14);
      __addr_len = (socklen_t *)
                   std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffd88);
      if (__addr_len < psVar15) {
        std::
        __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffd80);
        bVar2 = handle_snapshot_sync_req(in_stack_00000248,in_stack_00000240);
        if (bVar2) {
          std::
          __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x22206a);
          psVar14 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x222072);
          tVar4 = snapshot::get_type(psVar14);
          if (tVar4 == raw_binary) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2220a2);
            peVar18 = std::
                      __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2220b4);
            uVar8 = snapshot_sync_req::get_offset(peVar18);
            std::
            __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2220d0);
            pbVar19 = snapshot_sync_req::get_data((snapshot_sync_req *)0x2220d8);
            sVar20 = buffer::size(pbVar19);
            resp_msg::accept(peVar17,(int)uVar8 + (int)sVar20,__addr,__addr_len);
          }
          else {
            peVar17 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x22211b);
            peVar18 = std::
                      __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x22212d);
            pbVar19 = (buffer *)snapshot_sync_req::get_offset(peVar18);
            resp_msg::accept(peVar17,(int)pbVar19,__addr_00,__addr_len);
            peVar18 = std::
                      __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x22215a);
            bVar2 = snapshot_sync_req::is_done(peVar18);
            if (bVar2) {
              buffer::alloc(in_stack_fffffffffffffec8);
              std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x222196);
              buffer::pos(pbVar19,(size_t)peVar17);
              std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2221b1);
              buffer::put(in_stack_fffffffffffffdb0,b);
              std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2221ca);
              buffer::pos(pbVar19,(size_t)peVar17);
              peVar17 = std::
                        __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x2221e5);
              std::shared_ptr<nuraft::buffer>::shared_ptr
                        ((shared_ptr<nuraft::buffer> *)peVar17,in_stack_fffffffffffffd78);
              resp_msg::set_ctx(peVar17,in_stack_fffffffffffffd78);
              std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x222222);
              std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x22222f);
            }
          }
        }
        local_5d = 1;
        local_9c = 1;
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar2) {
          peVar12 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x221d07);
          iVar7 = (*peVar12->_vptr_logger[7])();
          if (2 < iVar7) {
            peVar12 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x221d40);
            std::
            __shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x221d55);
            psVar14 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x221d5d);
            uVar8 = snapshot::get_last_log_idx(psVar14);
            puVar16 = (undefined8 *)(in_RSI + 0xa0);
            local_c = 5;
            local_8 = puVar16;
            local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_c - 1U < 2) {
              local_18 = *puVar16;
            }
            else if (local_c == 5) {
              local_18 = *puVar16;
            }
            else {
              local_18 = *puVar16;
            }
            uVar1 = local_18;
            peVar11 = std::
                      __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x221e4a);
            iVar7 = (*peVar11->_vptr_log_store[2])();
            msg_if_given_abi_cxx11_
                      ((char *)local_f8,
                       "received a snapshot (%lu) that is older than current commit idx (%lu), last log idx %lu"
                       ,uVar8,uVar1,CONCAT44(extraout_var_00,iVar7) + -1);
            (*peVar12->_vptr_logger[8])
                      (peVar12,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0x124,local_f8);
            std::__cxx11::string::~string(local_f8);
          }
        }
        buffer::alloc(in_stack_fffffffffffffec8);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x221f33);
        buffer::pos(in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x221f4e);
        buffer::put(in_stack_fffffffffffffdb0,b);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x221f67);
        buffer::pos(in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x221f82);
        std::shared_ptr<nuraft::buffer>::shared_ptr
                  ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                  );
        resp_msg::set_ctx(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x221fbf);
        local_5d = 1;
        local_9c = 1;
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x221fdf);
      }
      std::shared_ptr<nuraft::snapshot_sync_req>::~shared_ptr
                ((shared_ptr<nuraft::snapshot_sync_req> *)0x22229b);
      _Var21._M_pi = extraout_RDX_05;
      goto LAB_002222ac;
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  _Var21._M_pi = extraout_RDX_02;
  if (bVar2) {
    peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x221b5c);
    iVar7 = (*peVar12->_vptr_logger[7])();
    _Var21._M_pi = extraout_RDX_03;
    if (2 < iVar7) {
      peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x221b95);
      msg_if_given_abi_cxx11_
                ((char *)local_c8,
                 "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
                );
      (*peVar12->_vptr_logger[8])
                (peVar12,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_req",0x119,local_c8);
      std::__cxx11::string::~string(local_c8);
      _Var21._M_pi = extraout_RDX_04;
    }
  }
  local_5d = 1;
  local_9c = 1;
LAB_002222ac:
  if ((local_5d & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x2222c3);
    _Var21._M_pi = extraout_RDX_06;
  }
  pVar22.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var21._M_pi;
  pVar22.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar22.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req) {
    if (req.get_term() == state_->get_term() && !catching_up_) {
        if (role_ == srv_role::candidate) {
            become_follower();

        } else if (role_ == srv_role::leader) {
            // LCOV_EXCL_START
            p_er( "Receive InstallSnapshotRequest from another leader(%d) "
                  "with same term, there must be a bug, server exits",
                  req.get_src() );
            ctx_->state_mgr_->system_exit
                ( raft_err::N10_leader_receive_InstallSnapshotRequest );
            ::exit(-1);
            return ptr<resp_msg>();
            // LCOV_EXCL_STOP

        } else {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::install_snapshot_response,
                           id_,
                           req.get_src(),
                           log_store_->next_slot() );

    if (!catching_up_ && req.get_term() < state_->get_term()) {
        p_wn("received an install snapshot request (%" PRIu64 ") which has lower term "
             "than this server (%" PRIu64 "), decline the request",
             req.get_term(), state_->get_term());
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::snp_sync_req ) {
        p_wn("Receive an invalid InstallSnapshotRequest due to "
             "bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req =
        snapshot_sync_req::deserialize(entries[0]->get_buf());
    if (sync_req->get_snapshot().get_last_log_idx() <= quick_commit_index_) {
        p_wn( "received a snapshot (%" PRIu64 ") that is older than "
              "current commit idx (%" PRIu64 "), last log idx %" PRIu64,
              sync_req->get_snapshot().get_last_log_idx(),
              quick_commit_index_.load(),
              log_store_->next_slot() - 1);
        // Put dummy CTX to end the snapshot sync.
        ptr<buffer> done_ctx = buffer::alloc(1);
        done_ctx->pos(0);
        done_ctx->put((byte)0);
        done_ctx->pos(0);
        resp->set_ctx(done_ctx);
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req)) {
        if (sync_req->get_snapshot().get_type() == snapshot::raw_binary) {
            // LCOV_EXCL_START
            // Raw binary: add received byte to offset.
            resp->accept(sync_req->get_offset() + sync_req->get_data().size());
            // LCOV_EXCL_STOP

        } else {
            // Object type: add one (next object index).
            resp->accept(sync_req->get_offset());
            if (sync_req->is_done()) {
                // TODO: check if there is missing object.
                // Add a context buffer to inform installation is done.
                ptr<buffer> done_ctx = buffer::alloc(1);
                done_ctx->pos(0);
                done_ctx->put((byte)0);
                done_ctx->pos(0);
                resp->set_ctx(done_ctx);
            }
        }
    }

    return resp;
}